

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O2

void plutovg_path_transform(plutovg_path_t *path,plutovg_matrix_t *matrix)

{
  plutovg_path_element_t *ppVar1;
  plutovg_path_command_t pVar2;
  plutovg_path_element_t *ppVar3;
  long lVar4;
  int i;
  int iVar5;
  
  ppVar3 = (path->elements).data;
  iVar5 = 0;
  do {
    if ((path->elements).size <= iVar5) {
      return;
    }
    ppVar1 = ppVar3 + iVar5;
    pVar2 = (ppVar1->header).command;
    lVar4 = 8;
    if ((pVar2 < PLUTOVG_PATH_COMMAND_CUBIC_TO) || (pVar2 == PLUTOVG_PATH_COMMAND_CLOSE)) {
LAB_001263bd:
      plutovg_matrix_map_point
                (matrix,(plutovg_point_t *)(lVar4 + (long)ppVar1),
                 (plutovg_point_t *)(lVar4 + (long)ppVar1));
    }
    else if (pVar2 == PLUTOVG_PATH_COMMAND_CUBIC_TO) {
      plutovg_matrix_map_point(matrix,&ppVar1[1].point,(plutovg_point_t *)(ppVar1 + 1));
      plutovg_matrix_map_point(matrix,&ppVar1[2].point,(plutovg_point_t *)(ppVar1 + 2));
      lVar4 = 0x18;
      goto LAB_001263bd;
    }
    iVar5 = iVar5 + *(int *)((long)ppVar1 + 4);
  } while( true );
}

Assistant:

void plutovg_path_transform(plutovg_path_t* path, const plutovg_matrix_t* matrix)
{
    plutovg_path_element_t* elements = path->elements.data;
    for(int i = 0; i < path->elements.size; i += elements[i].header.length) {
        switch(elements[i].header.command) {
        case PLUTOVG_PATH_COMMAND_MOVE_TO:
        case PLUTOVG_PATH_COMMAND_LINE_TO:
        case PLUTOVG_PATH_COMMAND_CLOSE:
            plutovg_matrix_map_point(matrix, &elements[i + 1].point, &elements[i + 1].point);
            break;
        case PLUTOVG_PATH_COMMAND_CUBIC_TO:
            plutovg_matrix_map_point(matrix, &elements[i + 1].point, &elements[i + 1].point);
            plutovg_matrix_map_point(matrix, &elements[i + 2].point, &elements[i + 2].point);
            plutovg_matrix_map_point(matrix, &elements[i + 3].point, &elements[i + 3].point);
            break;
        }
    }
}